

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_fbs.cpp
# Opt level: O2

Status __thiscall
flatbuffers::anon_unknown_0::FBSCodeGenerator::GenerateCodeString
          (FBSCodeGenerator *this,Parser *parser,string *filename,string *output)

{
  string local_30;
  
  GenerateFBS(&local_30,parser,filename,this->no_log_);
  std::__cxx11::string::operator=((string *)output,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return OK;
}

Assistant:

Status GenerateCodeString(const Parser &parser, const std::string &filename,
                            std::string &output) override {
    output = GenerateFBS(parser, filename, no_log_);
    return Status::OK;
  }